

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::GetSum
          (StatisticsAccumulation *this,Buffer *buffer,vector<double,_std::allocator<double>_> *sum)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pdVar4;
  size_t __n;
  bool bVar5;
  size_type __new_size;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if ((sum != (vector<double,_std::allocator<double>_> *)0x0) &&
       (bVar5 = false, 0 < this->num_statistics_order_)) {
      __new_size = (long)this->num_order_ + 1;
      if ((long)(sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(sum,__new_size);
      }
      if (this->numerically_stable_ == true) {
        pdVar2 = (buffer->first_order_statistics_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish;
        pdVar4 = (sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = buffer->zeroth_order_statistics_;
        for (pdVar3 = (buffer->first_order_statistics_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
          *pdVar4 = *pdVar3 * (double)iVar1;
          pdVar4 = pdVar4 + 1;
        }
        bVar5 = true;
      }
      else {
        pdVar4 = (buffer->first_order_statistics_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        bVar5 = true;
        __n = (long)(buffer->first_order_statistics_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar4;
        if (__n != 0) {
          memmove((sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,pdVar4,__n);
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool StatisticsAccumulation::GetSum(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* sum) const {
  if (!is_valid_ || num_statistics_order_ < 1 || NULL == sum) {
    return false;
  }

  if (sum->size() != static_cast<std::size_t>(num_order_ + 1)) {
    sum->resize(num_order_ + 1);
  }

  if (numerically_stable_) {
    const int n(buffer.zeroth_order_statistics_);
    std::transform(buffer.first_order_statistics_.begin(),
                   buffer.first_order_statistics_.end(), sum->begin(),
                   [n](double x) { return n * x; });
  } else {
    std::copy(buffer.first_order_statistics_.begin(),
              buffer.first_order_statistics_.end(), sum->begin());
  }

  return true;
}